

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_window_t * bov_window_new(int width,int height,char *win_name)

{
  int height_00;
  long lVar1;
  bov_window_t *title;
  int iVar2;
  GLFWmonitor *pGVar3;
  GLFWwindow *pGVar4;
  GLFWcursor *pGVar5;
  bov_text_t *pbVar6;
  double dVar7;
  GLfloat local_130 [2];
  GLubyte local_126 [34];
  GLfloat local_104 [2];
  GLubyte local_fb [195];
  double local_38;
  double cursorY;
  double cursorX;
  GLFWvidmode *mode;
  bov_window_t *window;
  char *win_name_local;
  int height_local;
  int width_local;
  
  window = (bov_window_t *)win_name;
  win_name_local._0_4_ = height;
  win_name_local._4_4_ = width;
  mode = (GLFWvidmode *)malloc(0xc0);
  if (mode == (GLFWvidmode *)0x0) {
    bov_error_log(0x30001,"Memory allocation failed");
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_window_new",0x2ed);
    exit(1);
  }
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,2);
  glfwWindowHint(0x2100d,0);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  if ((win_name_local._4_4_ == 0) || ((int)win_name_local == 0)) {
    pGVar3 = glfwGetPrimaryMonitor();
    cursorX = (double)glfwGetVideoMode(pGVar3);
    title = window;
    mode[2].height = ((GLFWvidmode *)cursorX)->width;
    mode[2].redBits = ((GLFWvidmode *)cursorX)->height;
    iVar2 = ((GLFWvidmode *)cursorX)->width;
    height_00 = ((GLFWvidmode *)cursorX)->height;
    pGVar3 = glfwGetPrimaryMonitor();
    pGVar4 = glfwCreateWindow(iVar2,height_00,(char *)title,pGVar3,(GLFWwindow *)0x0);
    *(GLFWwindow **)mode = pGVar4;
  }
  else {
    if ((int)win_name_local < 0) {
      glfwWindowHint(0x20003,0);
      win_name_local._0_4_ = -(int)win_name_local;
    }
    if (win_name_local._4_4_ < 0) {
      glfwWindowHint(0x20008,1);
      win_name_local._4_4_ = 100;
      win_name_local._0_4_ = 100;
    }
    mode[2].height = win_name_local._4_4_;
    mode[2].redBits = (int)win_name_local;
    pGVar4 = glfwCreateWindow(win_name_local._4_4_,(int)win_name_local,(char *)window,
                              (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    *(GLFWwindow **)mode = pGVar4;
  }
  lVar1._0_4_ = mode->width;
  lVar1._4_4_ = mode->height;
  if (lVar1 == 0) {
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(*(GLFWwindow **)mode);
  glfwSetWindowUserPointer(*(GLFWwindow **)mode,mode);
  iVar2 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar2 == 0) {
    bov_error_log(0x20004,"Failed to initialize OpenGL context");
    fprintf(_stderr,"\t(in function %s, line %d)\n","bov_window_new",800);
  }
  mode[1].redBits = 0x3f800000;
  glfwGetFramebufferSize
            (*(GLFWwindow **)mode,(int *)((long)&win_name_local + 4),(int *)&win_name_local);
  framebuffer_size_callback(*(GLFWwindow **)mode,win_name_local._4_4_,(int)win_name_local);
  mode[1].height = 0;
  mode[1].width = 0;
  mode[4].width = 0;
  mode[4].height = 0x100000;
  mode[1].greenBits = 0x3f800000;
  mode[1].blueBits = 0x3f800000;
  mode[1].refreshRate = 0x3f800000;
  mode[2].width = 0;
  glfwSetKeyCallback(*(GLFWwindow **)mode,key_callback);
  glfwSetFramebufferSizeCallback(*(GLFWwindow **)mode,framebuffer_size_callback);
  glfwSetWindowSizeCallback(*(GLFWwindow **)mode,window_size_callback);
  glfwSetMouseButtonCallback(*(GLFWwindow **)mode,mouse_button_callback);
  glfwSetCursorPosCallback(*(GLFWwindow **)mode,cursor_pos_callback);
  glfwSetScrollCallback(*(GLFWwindow **)mode,scroll_callback);
  glfwSwapInterval(1);
  (*glad_glClearColor)
            ((GLfloat)mode[1].greenBits,(GLfloat)mode[1].blueBits,(GLfloat)mode[1].refreshRate,
             (GLfloat)mode[2].width);
  (*glad_glEnable)(0x809d);
  (*glad_glEnable)(0xb44);
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glPointSize)(5.0);
  (*glad_glEnable)(0xb20);
  glfwSetTime(2.2250738585072014e-308);
  cursorY = 0.0;
  local_38 = 0.0;
  glfwGetCursorPos(*(GLFWwindow **)mode,&cursorY,&local_38);
  *(double *)&mode[2].blueBits = (cursorY * 2.0) / (double)mode[2].height - 1.0;
  dVar7 = 1.0 - local_38 / (double)mode[2].redBits;
  *(double *)(mode + 3) = dVar7 + dVar7 + -1.0;
  mode[3].redBits = 0;
  mode[3].greenBits = 0;
  mode[3].blueBits = 0;
  mode[3].refreshRate = 0;
  mode[4].redBits = 0;
  mode[6].greenBits = 1;
  mode[7].width = 0;
  mode[7].blueBits = 0;
  pGVar5 = glfwCreateStandardCursor(0x36005);
  *(GLFWcursor **)&mode->redBits = pGVar5;
  window_OpenGL_init((bov_window_t *)mode);
  memcpy(local_fb,
         " Keyboard shortcuts:\n -------------------\n\n   [esc]   exit\n  [space]  play/pause\n     p     save .ppm screenshot\n     r     reset zoom and translation\n    h k    display/hide keyboard shortcuts\n"
         ,0xc3);
  pbVar6 = bov_text_new(local_fb,0x88e4);
  *(bov_text_t **)&mode[6].blueBits = pbVar6;
  bov_text_set_space_type(*(bov_text_t **)&mode[6].blueBits,PIXEL_SPACE);
  bov_text_set_fontsize(*(bov_text_t **)&mode[6].blueBits,32.0);
  local_104[0] = 16.0;
  local_104[1] = 288.0;
  bov_text_set_pos(*(bov_text_t **)&mode[6].blueBits,local_104);
  bov_text_set_boldness(*(bov_text_t **)&mode[6].blueBits,0.1);
  bov_text_set_outline_width(*(bov_text_t **)&mode[6].blueBits,0.5);
  memcpy(local_126,"press \'k\' for keyboard shortcuts\n",0x22);
  pbVar6 = bov_text_new(local_126,0x88e4);
  *(bov_text_t **)&mode[7].redBits = pbVar6;
  bov_text_set_space_type(*(bov_text_t **)&mode[7].redBits,PIXEL_SPACE);
  bov_text_set_fontsize(*(bov_text_t **)&mode[7].redBits,32.0);
  local_130[0] = 16.0;
  local_130[1] = 16.0;
  bov_text_set_pos(*(bov_text_t **)&mode[7].redBits,local_130);
  bov_text_set_boldness(*(bov_text_t **)&mode[7].redBits,0.1);
  bov_text_set_outline_width(*(bov_text_t **)&mode[7].redBits,0.5);
  return (bov_window_t *)mode;
}

Assistant:

bov_window_t* bov_window_new(int width, int height, const char* win_name)
{
	bov_window_t* window = malloc(sizeof(bov_window_t));
	CHECK_MALLOC(window);

	glfwSetErrorCallback(error_callback);

	if(!glfwInit())
		exit(EXIT_FAILURE);

	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
	glfwWindowHint(GLFW_SAMPLES, 0); // we disable multisampling has we already use shader antialiasing
	glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	if(width==0 || height==0) {
		const GLFWvidmode* mode = glfwGetVideoMode(glfwGetPrimaryMonitor());
		window->size[0] = mode->width;
		window->size[1] = mode->height;
		window->self = glfwCreateWindow(mode->width, mode->height, win_name,
		                                glfwGetPrimaryMonitor(), // fullscreen
		                                NULL);
	}
	else {
		if(height<0) {
			glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
			height = -height;
		}

		if(width<0) {
			glfwWindowHint(GLFW_MAXIMIZED, GLFW_TRUE);
			width = 100;
			height = 100;
		}
		window->size[0] = width;


		window->size[1] = height;

		window->self = glfwCreateWindow(width, height, win_name, NULL, NULL);
	}

	if(!window->self) {
		glfwTerminate();
		exit(EXIT_FAILURE);
	}

	glfwMakeContextCurrent(window->self);
	glfwSetWindowUserPointer(window->self,window);

	// load opengl functions with GLAD
	if(!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress))
		BOV_ERROR_LOG(BOV_GLAD_ERROR,
		              "Failed to initialize OpenGL context");

	window->param.zoom = 1.0;
	glfwGetFramebufferSize(window->self, &width, &height);
	framebuffer_size_callback(window->self, width, height);
	window->param.translate[0] = window->param.translate[1] = 0.0;
	window->wtime = DBL_MIN;

	// white background color
	window->backgroundColor[0] = 1.0;
	window->backgroundColor[1] = 1.0;
	window->backgroundColor[2] = 1.0;
	window->backgroundColor[3] = 0.0;

	// glfwSetWindowCloseCallback(window->self,close_callback);
	glfwSetKeyCallback(window->self, key_callback);
	glfwSetFramebufferSizeCallback(window->self, framebuffer_size_callback);
	glfwSetWindowSizeCallback(window->self, window_size_callback);
	glfwSetMouseButtonCallback(window->self, mouse_button_callback);
	glfwSetCursorPosCallback(window->self, cursor_pos_callback);
	glfwSetScrollCallback(window->self, scroll_callback);

	//glfwSetInputMode(window->self,GLFW_CURSOR,GLFW_CURSOR_HIDDEN);


	glfwSwapInterval(1); // vsync
	glClearColor(window->backgroundColor[0],
	             window->backgroundColor[1],
	             window->backgroundColor[2],
	             window->backgroundColor[3]);
	glEnable(GL_MULTISAMPLE);
	glEnable(GL_CULL_FACE); // cull face that are not counterclockwise
	glEnable( GL_BLEND );
	glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

	glPointSize(5); // 10 pixels for a point
	glEnable( GL_LINE_SMOOTH );

	glfwSetTime(DBL_MIN); // set the time to 0

	{
		double cursorX = 0.0, cursorY = 0.0;
		glfwGetCursorPos(window->self, &cursorX, &cursorY);
		window->cursorPos[0] = 2.0 * cursorX / window->size[0] - 1.0;
		window->cursorPos[1] = 2.0 * (1.0 - cursorY / window->size[1]) - 1.0;
		window->clickTime[0] = 0.0;
		window->clickTime[1] = 0.0;
	}

	window->counter = 0;
	window->running = 1;
	window->help_needed = 0;
	window->indication_needed = 0;
	window->leftClickCursor = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);

	window_OpenGL_init(window);

	window->help = bov_text_new((GLubyte[]) {
		" Keyboard shortcuts:\n"
		" -------------------\n\n"
		"   [esc]   exit\n"
		"  [space]  play/pause\n"
		"     p     save .ppm screenshot\n"
		"     r     reset zoom and translation\n"
		"    h k    display/hide keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->help, PIXEL_SPACE);
	bov_text_set_fontsize(window->help, 32.0f); // 32 pixel height
	bov_text_set_pos(window->help, (GLfloat[2]){16.0f, 7.0f * 32.0f + 64.0f});
	bov_text_set_boldness(window->help, 0.1f);
	bov_text_set_outline_width(window->help, 0.5f);

	window->indication = bov_text_new((GLubyte[]) {
		"press 'k' for keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->indication, PIXEL_SPACE);
	bov_text_set_fontsize(window->indication, 32.0f); // 32 pixel height
	bov_text_set_pos(window->indication, (GLfloat[2]){16.0f, 16.0f});
	bov_text_set_boldness(window->indication, 0.1f);
	bov_text_set_outline_width(window->indication, 0.5f);

	return window;
}